

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O0

lzma_ret lzma_index_encoder_init
                   (lzma_next_coder_conflict12 *next,lzma_allocator *allocator,lzma_index *i)

{
  lzma_coder_conflict13 *plVar1;
  lzma_index *i_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict12 *next_local;
  
  if ((code *)next->init != lzma_index_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_index_encoder_init;
  if (i == (lzma_index *)0x0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    if (next->coder == (lzma_coder_conflict13 *)0x0) {
      plVar1 = (lzma_coder_conflict13 *)lzma_alloc(0x150,allocator);
      next->coder = plVar1;
      if (next->coder == (lzma_coder_conflict13 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = index_encode;
      next->end = index_encoder_end;
    }
    index_encoder_reset(next->coder,i);
    next_local._4_4_ = LZMA_OK;
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_index_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_index *i)
{
	lzma_next_coder_init(&lzma_index_encoder_init, next, allocator);

	if (i == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &index_encode;
		next->end = &index_encoder_end;
	}

	index_encoder_reset(next->coder, i);

	return LZMA_OK;
}